

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::AncillaryMessage>::setCapacity(Vector<kj::AncillaryMessage> *this,size_t newSize)

{
  AncillaryMessage *pAVar1;
  RemoveConst<kj::AncillaryMessage> *pRVar2;
  AncillaryMessage *pAVar3;
  ulong uVar4;
  size_t __n;
  ArrayBuilder<kj::AncillaryMessage> local_48;
  
  pAVar1 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pAVar1 >> 3) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pAVar1 + newSize;
  }
  pAVar3 = (AncillaryMessage *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = pAVar3 + newSize;
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pAVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pAVar1;
  local_48.ptr = pAVar3;
  if (__n != 0) {
    memcpy(pAVar3,pAVar1,__n);
  }
  local_48.pos = (RemoveConst<kj::AncillaryMessage> *)((long)pAVar3 + __n);
  ArrayBuilder<kj::AncillaryMessage>::operator=(&this->builder,&local_48);
  pAVar3 = local_48.endPtr;
  pRVar2 = local_48.pos;
  pAVar1 = local_48.ptr;
  if (local_48.ptr != (AncillaryMessage *)0x0) {
    local_48.ptr = (AncillaryMessage *)0x0;
    local_48.pos = (RemoveConst<kj::AncillaryMessage> *)0x0;
    local_48.endPtr = (AncillaryMessage *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pAVar1,0x18,
               ((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }